

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

size_t mpack_expect_bin_buf(mpack_reader_t *reader,char *buf,size_t bufsize)

{
  uint32_t uVar1;
  mpack_error_t mVar2;
  size_t binsize;
  size_t bufsize_local;
  char *buf_local;
  mpack_reader_t *reader_local;
  
  uVar1 = mpack_expect_bin(reader);
  reader_local = (mpack_reader_t *)(ulong)uVar1;
  mVar2 = mpack_reader_error(reader);
  if (mVar2 == mpack_ok) {
    if (bufsize < reader_local) {
      mpack_reader_flag_error(reader,mpack_error_too_big);
      reader_local = (mpack_reader_t *)0x0;
    }
    else {
      mpack_read_bytes(reader,buf,(size_t)reader_local);
      mVar2 = mpack_reader_error(reader);
      if (mVar2 == mpack_ok) {
        mpack_done_bin(reader);
      }
      else {
        reader_local = (mpack_reader_t *)0x0;
      }
    }
  }
  else {
    reader_local = (mpack_reader_t *)0x0;
  }
  return (size_t)reader_local;
}

Assistant:

size_t mpack_expect_bin_buf(mpack_reader_t* reader, char* buf, size_t bufsize) {
    mpack_assert(buf != NULL, "buf cannot be NULL");

    size_t binsize = mpack_expect_bin(reader);
    if (mpack_reader_error(reader))
        return 0;
    if (binsize > bufsize) {
        mpack_reader_flag_error(reader, mpack_error_too_big);
        return 0;
    }
    mpack_read_bytes(reader, buf, binsize);
    if (mpack_reader_error(reader))
        return 0;
    mpack_done_bin(reader);
    return binsize;
}